

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef.cpp
# Opt level: O0

void SetImplicitArgs(TArray<PType_*,_PType_*> *args,TArray<unsigned_int,_unsigned_int> *argflags,
                    TArray<FName,_FName> *argnames,PStruct *cls,DWORD funcflags,int useflags)

{
  TArray<unsigned_int,_unsigned_int> *pTVar1;
  uint uVar2;
  PStruct *pPVar3;
  bool bVar4;
  FName local_6c;
  FName local_68;
  uint local_64 [2];
  FName local_5c;
  PPointer *local_58;
  PPointer *local_50;
  PPointer *local_48;
  FName local_40;
  uint local_3c;
  PPointer *local_38;
  uint local_30;
  DWORD local_2c;
  int useflags_local;
  DWORD funcflags_local;
  PStruct *cls_local;
  TArray<FName,_FName> *argnames_local;
  TArray<unsigned_int,_unsigned_int> *argflags_local;
  TArray<PType_*,_PType_*> *args_local;
  
  bVar4 = true;
  local_30 = useflags;
  local_2c = funcflags;
  _useflags_local = cls;
  cls_local = (PStruct *)argnames;
  argnames_local = (TArray<FName,_FName> *)argflags;
  argflags_local = (TArray<unsigned_int,_unsigned_int> *)args;
  if (args != (TArray<PType_*,_PType_*> *)0x0) {
    uVar2 = TArray<PType_*,_PType_*>::Size(args);
    bVar4 = uVar2 == 0;
  }
  if (!bVar4) {
    __assert_fail("args == nullptr || args->Size() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef.cpp"
                  ,0x6e,
                  "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, TArray<FName> *, PStruct *, DWORD, int)"
                 );
  }
  bVar4 = true;
  if (argnames_local != (TArray<FName,_FName> *)0x0) {
    uVar2 = TArray<unsigned_int,_unsigned_int>::Size
                      ((TArray<unsigned_int,_unsigned_int> *)argnames_local);
    bVar4 = uVar2 == 0;
  }
  pTVar1 = argflags_local;
  if (bVar4) {
    if ((local_2c & 2) != 0) {
      if (argflags_local != (TArray<unsigned_int,_unsigned_int> *)0x0) {
        local_38 = NewPointer((PType *)_useflags_local,false);
        TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)pTVar1,(PType **)&local_38);
      }
      if (argnames_local != (TArray<FName,_FName> *)0x0) {
        local_3c = 0x1010;
        TArray<unsigned_int,_unsigned_int>::Push
                  ((TArray<unsigned_int,_unsigned_int> *)argnames_local,&local_3c);
      }
      pPVar3 = cls_local;
      if (cls_local != (PStruct *)0x0) {
        FName::FName(&local_40,NAME_self);
        TArray<FName,_FName>::Push((TArray<FName,_FName> *)pPVar3,&local_40);
      }
    }
    pTVar1 = argflags_local;
    if ((local_2c & 4) != 0) {
      if (argflags_local != (TArray<unsigned_int,_unsigned_int> *)0x0) {
        if ((local_30 & 0xc) == 0) {
          local_50 = NewPointer((PType *)_useflags_local,false);
          TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)pTVar1,(PType **)&local_50);
        }
        else {
          local_48 = NewPointer((PType *)AActor::RegistrationInfo.MyClass,false);
          TArray<PType_*,_PType_*>::Insert((TArray<PType_*,_PType_*> *)pTVar1,0,(PType **)&local_48)
          ;
        }
        pTVar1 = argflags_local;
        FName::FName(&local_5c,"FStateParamInfo");
        pPVar3 = NewStruct(&local_5c,(PTypeBase *)0x0);
        local_58 = NewPointer((PType *)pPVar3,false);
        TArray<PType_*,_PType_*>::Push((TArray<PType_*,_PType_*> *)pTVar1,(PType **)&local_58);
      }
      if (argnames_local != (TArray<FName,_FName> *)0x0) {
        local_64[1] = 0x1010;
        TArray<unsigned_int,_unsigned_int>::Push
                  ((TArray<unsigned_int,_unsigned_int> *)argnames_local,local_64 + 1);
        local_64[0] = 0x1010;
        TArray<unsigned_int,_unsigned_int>::Push
                  ((TArray<unsigned_int,_unsigned_int> *)argnames_local,local_64);
      }
      pPVar3 = cls_local;
      if (cls_local != (PStruct *)0x0) {
        FName::FName(&local_68,NAME_invoker);
        TArray<FName,_FName>::Push((TArray<FName,_FName> *)pPVar3,&local_68);
        pPVar3 = cls_local;
        FName::FName(&local_6c,NAME_stateinfo);
        TArray<FName,_FName>::Push((TArray<FName,_FName> *)pPVar3,&local_6c);
      }
    }
    return;
  }
  __assert_fail("argflags == nullptr || argflags->Size() == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/scripting/thingdef.cpp"
                ,0x6f,
                "void SetImplicitArgs(TArray<PType *> *, TArray<DWORD> *, TArray<FName> *, PStruct *, DWORD, int)"
               );
}

Assistant:

void SetImplicitArgs(TArray<PType *> *args, TArray<DWORD> *argflags, TArray<FName> *argnames, PStruct *cls, DWORD funcflags, int useflags)
{
	// Must be called before adding any other arguments.
	assert(args == nullptr || args->Size() == 0);
	assert(argflags == nullptr || argflags->Size() == 0);

	if (funcflags & VARF_Method)
	{
		// implied self pointer
		if (args != nullptr)		args->Push(NewPointer(cls)); 
		if (argflags != nullptr)	argflags->Push(VARF_Implicit | VARF_ReadOnly);
		if (argnames != nullptr)	argnames->Push(NAME_self);
	}
	if (funcflags & VARF_Action)
	{
		// implied caller and callingstate pointers
		if (args != nullptr)
		{
			// Special treatment for weapons and CustomInventory flagged functions: 'self' is not the defining class but the actual user of the item, so this pointer must be of type 'Actor'
			if (useflags & (SUF_WEAPON|SUF_ITEM))
			{
				args->Insert(0, NewPointer(RUNTIME_CLASS(AActor)));	// this must go in before the real pointer to the containing class.
			}
			else
			{
				args->Push(NewPointer(cls));
			}
			args->Push(NewPointer(NewStruct("FStateParamInfo", nullptr)));
		}
		if (argflags != nullptr)
		{
			argflags->Push(VARF_Implicit | VARF_ReadOnly);
			argflags->Push(VARF_Implicit | VARF_ReadOnly);
		}
		if (argnames != nullptr)
		{
			argnames->Push(NAME_invoker);
			argnames->Push(NAME_stateinfo);
		}
	}
}